

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int compressedSize,
              int maxOutputSize)

{
  ushort *puVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  ushort uVar5;
  ulong uVar6;
  undefined8 uVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  LZ4_byte *pLVar11;
  ushort *puVar12;
  long lVar13;
  byte *pbVar14;
  byte *pbVar15;
  ushort *puVar16;
  size_t __n;
  byte *pbVar17;
  byte *__src;
  ulong uVar18;
  BYTE *s_1;
  ushort *puVar19;
  ushort *__src_00;
  uint uVar20;
  byte *pbVar21;
  ushort *puVar22;
  BYTE *e;
  BYTE *d;
  byte *pbVar23;
  byte *pbVar24;
  ulong uVar25;
  int local_88;
  int local_78;
  
  uVar18 = (LZ4_streamDecode->internal_donotuse).prefixSize;
  if (uVar18 == 0) {
    uVar9 = LZ4_decompress_safe(source,dest,compressedSize,maxOutputSize);
  }
  else {
    if ((LZ4_streamDecode->internal_donotuse).prefixEnd == (LZ4_byte *)dest) {
      if (uVar18 < 0xffff) {
        uVar6 = LZ4_streamDecode->table[1];
        if (uVar6 != 0) {
          if (source == (char *)0x0) {
            return -1;
          }
          pLVar11 = (LZ4_streamDecode->internal_donotuse).externalDict + uVar6;
          if ((LZ4_streamDecode->internal_donotuse).externalDict == (LZ4_byte *)0x0) {
            pLVar11 = (LZ4_byte *)0x0;
          }
          if (maxOutputSize == 0) {
            if (compressedSize != 1) {
              return -1;
            }
            return -(uint)(*source != '\0');
          }
          if (compressedSize == 0) {
            return -1;
          }
          __src = (byte *)(dest + -uVar18);
          puVar1 = (ushort *)(source + compressedSize);
          pbVar2 = (byte *)(dest + maxOutputSize);
          puVar22 = (ushort *)source;
          pbVar24 = (byte *)dest;
          if (maxOutputSize < 0x40) goto LAB_0014326a;
LAB_00142eaf:
          __src_00 = (ushort *)((long)puVar22 + 1);
          bVar4 = (byte)*puVar22;
          uVar18 = (ulong)(uint)(bVar4 >> 4);
          if (bVar4 >> 4 == 0xf) {
            if ((ushort *)((long)puVar1 - 0xfU) <= __src_00) goto LAB_0014324e;
            puVar16 = puVar22 + 1;
            uVar20 = 0;
            puVar22 = puVar22 + 8;
            do {
              puVar19 = __src_00;
              puVar12 = puVar22;
              __src_00 = (ushort *)((long)puVar19 + 1);
              uVar20 = uVar20 + *(byte *)((long)puVar12 + -0xf);
              puVar16 = (ushort *)((long)puVar16 + 1);
              puVar22 = (ushort *)((long)puVar12 + 1);
            } while (puVar12 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                     *(byte *)((long)puVar12 + -0xf) == 0xff);
            uVar18 = (ulong)uVar20 + 0xf;
            pbVar23 = pbVar24 + uVar18;
            if ((CARRY8((ulong)pbVar24,uVar18)) || ((ulong)-(long)puVar16 < uVar18)) {
              __src_00 = puVar12 + -7;
              goto LAB_0014324e;
            }
            uVar9 = (uint)bVar4;
            if (dest + (long)maxOutputSize + -0x20 < pbVar23) goto LAB_00143354;
            puVar22 = (ushort *)((ulong)uVar20 + (long)puVar12 + 1);
            if (puVar1 + -0x10 < puVar22) {
              __src_00 = puVar12 + -7;
              uVar9 = (uint)bVar4;
              goto LAB_00143354;
            }
            lVar13 = 0;
            do {
              uVar7 = *(undefined8 *)((byte *)((long)__src_00 + lVar13) + 8);
              pbVar14 = pbVar24 + lVar13;
              *(undefined8 *)pbVar14 = *(undefined8 *)((long)__src_00 + lVar13);
              *(undefined8 *)(pbVar14 + 8) = uVar7;
              pbVar3 = (byte *)((long)puVar19 + lVar13 + 0x11);
              uVar7 = *(undefined8 *)(pbVar3 + 8);
              *(undefined8 *)(pbVar14 + 0x10) = *(undefined8 *)pbVar3;
              *(undefined8 *)(pbVar14 + 0x18) = uVar7;
              lVar13 = lVar13 + 0x20;
            } while (pbVar14 + 0x20 < pbVar23);
          }
          else {
            pbVar23 = pbVar24 + uVar18;
            uVar9 = (uint)bVar4;
            if ((ushort *)((long)puVar1 - 0x11U) < __src_00) goto LAB_00143354;
            uVar7 = *(undefined8 *)((long)puVar22 + 9);
            *(undefined8 *)pbVar24 = *(undefined8 *)__src_00;
            *(undefined8 *)(pbVar24 + 8) = uVar7;
            puVar22 = (ushort *)(uVar18 + (long)__src_00);
          }
          uVar5 = *puVar22;
          uVar18 = (ulong)uVar5;
          uVar9 = (uint)uVar5;
          __src_00 = puVar22 + 1;
          pbVar14 = pbVar23 + -uVar18;
          uVar25 = (ulong)(bVar4 & 0xf);
          if (uVar25 == 0xf) {
            if ((uVar6 < 0x10000) && (pbVar14 + uVar6 < __src)) goto LAB_0014324e;
            uVar9 = 0;
            puVar22 = __src_00;
            do {
              __src_00 = (ushort *)((long)puVar22 + 1);
              if (puVar1 + -2 <= __src_00) goto LAB_0014324e;
              uVar8 = *puVar22;
              uVar9 = uVar9 + (byte)uVar8;
              puVar22 = __src_00;
            } while ((byte)uVar8 == 0xff);
            uVar25 = (ulong)uVar9;
            if ((byte *)(-0x10 - uVar25) < pbVar23) goto LAB_0014324e;
            __n = uVar25 + 0x13;
            if (pbVar2 + -0x40 <= pbVar23 + uVar25 + 0x13) goto LAB_001433f8;
LAB_0014304e:
            if ((uVar6 < 0x10000) && (pbVar14 + uVar6 < __src)) goto LAB_0014324e;
            pbVar3 = pbVar23 + __n;
            puVar22 = __src_00;
            pbVar24 = pbVar3;
            if (__src <= pbVar14) {
              if (0xf < uVar5) {
                do {
                  uVar7 = *(undefined8 *)(pbVar23 + -uVar18 + 8);
                  *(undefined8 *)pbVar23 = *(undefined8 *)(pbVar23 + -uVar18);
                  *(undefined8 *)(pbVar23 + 8) = uVar7;
                  uVar7 = *(undefined8 *)(pbVar23 + -uVar18 + 0x10 + 8);
                  *(undefined8 *)(pbVar23 + 0x10) = *(undefined8 *)(pbVar23 + -uVar18 + 0x10);
                  *(undefined8 *)(pbVar23 + 0x18) = uVar7;
                  pbVar23 = pbVar23 + 0x20;
                } while (pbVar23 < pbVar3);
                goto LAB_00142eaf;
              }
              if (uVar18 == 4) {
                iVar10 = *(int *)pbVar14;
              }
              else if (uVar5 == 2) {
                iVar10 = CONCAT22(*(undefined2 *)pbVar14,*(undefined2 *)pbVar14);
              }
              else {
                if (uVar5 != 1) {
                  if (uVar5 < 8) {
                    pbVar23[0] = 0;
                    pbVar23[1] = 0;
                    pbVar23[2] = 0;
                    pbVar23[3] = 0;
                    *pbVar23 = *pbVar14;
                    pbVar23[1] = pbVar14[1];
                    pbVar23[2] = pbVar14[2];
                    pbVar23[3] = pbVar14[3];
                    uVar9 = inc32table[uVar5];
                    *(undefined4 *)(pbVar23 + 4) = *(undefined4 *)(pbVar14 + uVar9);
                    pbVar14 = pbVar14 + ((ulong)uVar9 - (long)dec64table[uVar5]);
                  }
                  else {
                    *(undefined8 *)pbVar23 = *(undefined8 *)pbVar14;
                    pbVar14 = pbVar14 + 8;
                  }
                  pbVar23 = pbVar23 + 8;
                  do {
                    *(undefined8 *)pbVar23 = *(undefined8 *)pbVar14;
                    pbVar23 = pbVar23 + 8;
                    pbVar14 = pbVar14 + 8;
                  } while (pbVar23 < pbVar3);
                  goto LAB_00142eaf;
                }
                iVar10 = (uint)*pbVar14 * 0x1010101;
              }
              do {
                *(int *)pbVar23 = iVar10;
                *(int *)(pbVar23 + 4) = iVar10;
                pbVar23 = pbVar23 + 8;
              } while (pbVar23 < pbVar3);
              goto LAB_00142eaf;
            }
            if (pbVar2 + -5 < pbVar3) goto LAB_0014324e;
            uVar18 = (long)__src - (long)pbVar14;
            uVar25 = __n - uVar18;
            if (__n < uVar18 || uVar25 == 0) {
              memmove(pbVar23,pLVar11 + -uVar18,__n);
            }
            else {
              memcpy(pbVar23,pLVar11 + -uVar18,uVar18);
              pbVar24 = pbVar23 + uVar18;
              pbVar23 = __src;
              if ((ulong)((long)pbVar24 - (long)__src) < uVar25) {
                for (; pbVar24 < pbVar3; pbVar24 = pbVar24 + 1) {
                  *pbVar24 = *pbVar23;
                  pbVar23 = pbVar23 + 1;
                }
              }
              else {
                memcpy(pbVar24,__src,uVar25);
                pbVar24 = pbVar3;
              }
            }
          }
          else {
            __n = uVar25 + 4;
            if (pbVar2 + -0x40 <= pbVar23 + uVar25 + 4) goto LAB_001433fb;
            if ((pbVar14 < __src) || (uVar5 < 8)) goto LAB_0014304e;
            *(undefined8 *)pbVar23 = *(undefined8 *)pbVar14;
            *(undefined8 *)(pbVar23 + 8) = *(undefined8 *)(pbVar14 + 8);
            *(undefined2 *)(pbVar23 + 0x10) = *(undefined2 *)(pbVar14 + 0x10);
            puVar22 = __src_00;
            pbVar24 = pbVar23 + uVar25 + 4;
          }
          goto LAB_00142eaf;
        }
        uVar9 = LZ4_decompress_safe_withSmallPrefix(source,dest,compressedSize,maxOutputSize,uVar18)
        ;
      }
      else {
        uVar9 = LZ4_decompress_safe_withPrefix64k(source,dest,compressedSize,maxOutputSize);
      }
      goto LAB_0014322f;
    }
    (LZ4_streamDecode->internal_donotuse).extDictSize = uVar18;
    pLVar11 = (LZ4_streamDecode->internal_donotuse).prefixEnd + -uVar18;
    (LZ4_streamDecode->internal_donotuse).externalDict = pLVar11;
    uVar9 = LZ4_decompress_safe_forceExtDict
                      (source,dest,compressedSize,maxOutputSize,pLVar11,uVar18);
  }
  if ((int)uVar9 < 1) {
    return uVar9;
  }
  LZ4_streamDecode->table[3] = (ulong)uVar9;
  (LZ4_streamDecode->internal_donotuse).prefixEnd = (LZ4_byte *)(dest + uVar9);
  return uVar9;
LAB_001433fb:
  if ((uVar6 < 0x10000) && (pbVar14 + uVar6 < __src)) goto LAB_0014324e;
  pbVar3 = pbVar23 + __n;
  puVar22 = __src_00;
  pbVar24 = pbVar3;
  if (pbVar14 < __src) {
    if (pbVar2 + -5 < pbVar3) goto LAB_0014324e;
    uVar18 = (long)__src - (long)pbVar14;
    uVar25 = __n - uVar18;
    if (__n < uVar18 || uVar25 == 0) {
      memmove(pbVar23,pLVar11 + -uVar18,__n);
    }
    else {
      memcpy(pbVar23,pLVar11 + -uVar18,uVar18);
      pbVar24 = pbVar23 + uVar18;
      pbVar23 = __src;
      if ((ulong)((long)pbVar24 - (long)__src) < uVar25) {
        for (; pbVar24 < pbVar3; pbVar24 = pbVar24 + 1) {
          *pbVar24 = *pbVar23;
          pbVar23 = pbVar23 + 1;
        }
      }
      else {
        memcpy(pbVar24,__src,uVar25);
        pbVar24 = pbVar3;
      }
    }
  }
  else {
    if (uVar9 < 8) {
      pbVar23[0] = 0;
      pbVar23[1] = 0;
      pbVar23[2] = 0;
      pbVar23[3] = 0;
      *pbVar23 = *pbVar14;
      pbVar23[1] = pbVar14[1];
      pbVar23[2] = pbVar14[2];
      pbVar23[3] = pbVar14[3];
      uVar18 = (ulong)*(uint *)((long)inc32table + (ulong)(uVar9 << 2));
      *(undefined4 *)(pbVar23 + 4) = *(undefined4 *)(pbVar14 + uVar18);
      pbVar14 = pbVar14 + (uVar18 - (long)*(int *)((long)dec64table + (ulong)(uVar9 << 2)));
    }
    else {
      *(undefined8 *)pbVar23 = *(undefined8 *)pbVar14;
      pbVar14 = pbVar14 + 8;
    }
    pbVar15 = pbVar23 + 8;
    if (pbVar2 + -0xc < pbVar3) {
      if (pbVar2 + -5 < pbVar3) goto LAB_0014324e;
      pbVar23 = pbVar2 + -7;
      pbVar17 = pbVar14;
      pbVar21 = pbVar15;
      if (pbVar15 < pbVar23) {
        do {
          *(undefined8 *)pbVar21 = *(undefined8 *)pbVar17;
          pbVar21 = pbVar21 + 8;
          pbVar17 = pbVar17 + 8;
        } while (pbVar21 < pbVar23);
        pbVar14 = pbVar14 + ((long)pbVar23 - (long)pbVar15);
        pbVar15 = pbVar23;
      }
      for (; pbVar15 < pbVar3; pbVar15 = pbVar15 + 1) {
        bVar4 = *pbVar14;
        pbVar14 = pbVar14 + 1;
        *pbVar15 = bVar4;
      }
    }
    else {
      *(undefined8 *)pbVar15 = *(undefined8 *)pbVar14;
      if (0x10 < __n) {
        pbVar23 = pbVar23 + 0x10;
        do {
          pbVar14 = pbVar14 + 8;
          *(undefined8 *)pbVar23 = *(undefined8 *)pbVar14;
          pbVar23 = pbVar23 + 8;
        } while (pbVar23 < pbVar3);
      }
    }
  }
LAB_0014326a:
  while( true ) {
    __src_00 = (ushort *)((long)puVar22 + 1);
    bVar4 = (byte)*puVar22;
    uVar18 = (ulong)(uint)(bVar4 >> 4);
    if (bVar4 >> 4 == 0xf) break;
    if ((source + (long)compressedSize + -0x10 <= __src_00) ||
       (dest + (long)maxOutputSize + -0x20 < pbVar24)) goto LAB_00143350;
    uVar7 = *(undefined8 *)((long)puVar22 + 9);
    *(undefined8 *)pbVar24 = *(undefined8 *)__src_00;
    *(undefined8 *)(pbVar24 + 8) = uVar7;
    pbVar23 = pbVar24 + uVar18;
    uVar25 = (ulong)(bVar4 & 0xf);
    puVar22 = (ushort *)(uVar18 + (long)__src_00);
    __src_00 = puVar22 + 1;
    uVar5 = *puVar22;
    uVar18 = (ulong)uVar5;
    pbVar14 = pbVar23 + -uVar18;
    if (((uVar25 == 0xf) || (uVar5 < 8)) || (pbVar14 < __src)) goto LAB_001433a2;
    *(undefined8 *)pbVar23 = *(undefined8 *)pbVar14;
    *(undefined8 *)(pbVar23 + 8) = *(undefined8 *)(pbVar14 + 8);
    *(undefined2 *)(pbVar23 + 0x10) = *(undefined2 *)(pbVar14 + 0x10);
    puVar22 = __src_00;
    pbVar24 = pbVar23 + uVar25 + 4;
  }
  if ((ushort *)((long)puVar1 - 0xfU) <= __src_00) goto LAB_0014324e;
  puVar22 = puVar22 + 1;
  uVar9 = 0;
  do {
    uVar5 = *__src_00;
    __src_00 = (ushort *)((long)__src_00 + 1);
    uVar9 = uVar9 + (byte)uVar5;
    puVar22 = (ushort *)((long)puVar22 + 1);
  } while (__src_00 < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar5 == 0xff);
  uVar18 = (ulong)uVar9 + 0xf;
  if ((CARRY8((ulong)pbVar24,uVar18)) || ((ulong)-(long)puVar22 < uVar18)) goto LAB_0014324e;
LAB_00143350:
  pbVar23 = pbVar24 + uVar18;
  uVar9 = (uint)bVar4;
LAB_00143354:
  puVar22 = (ushort *)(uVar18 + (long)__src_00);
  if ((pbVar23 <= pbVar2 + -0xc) && (puVar22 <= puVar1 + -4)) {
    do {
      *(undefined8 *)pbVar24 = *(undefined8 *)__src_00;
      pbVar24 = pbVar24 + 8;
      __src_00 = __src_00 + 4;
    } while (pbVar24 < pbVar23);
    uVar18 = (ulong)*puVar22;
    __src_00 = puVar22 + 1;
    pbVar14 = pbVar23 + -uVar18;
    uVar25 = (ulong)(uVar9 & 0xf);
LAB_001433a2:
    if ((int)uVar25 == 0xf) {
      uVar9 = 0;
      do {
        uVar5 = *__src_00;
        __src_00 = (ushort *)((long)__src_00 + 1);
        uVar9 = uVar9 + (byte)uVar5;
      } while ((byte)uVar5 == 0xff && __src_00 < puVar1 + -2);
      uVar25 = (ulong)uVar9 + 0xf;
      if ((puVar1 + -2 <= __src_00) || (CARRY8((ulong)pbVar23,uVar25))) goto LAB_0014324e;
    }
    __n = uVar25 + 4;
LAB_001433f8:
    uVar9 = (uint)uVar18;
    goto LAB_001433fb;
  }
  if ((puVar22 == puVar1) && (pbVar23 <= pbVar2)) {
    memmove(pbVar24,__src_00,uVar18);
    local_88 = (int)dest;
    uVar9 = ((int)pbVar24 + (int)uVar18) - local_88;
    goto LAB_0014322f;
  }
LAB_0014324e:
  local_78 = (int)source;
  uVar9 = ~(uint)__src_00 + local_78;
LAB_0014322f:
  if (0 < (int)uVar9) {
    LZ4_streamDecode->table[3] = LZ4_streamDecode->table[3] + (ulong)uVar9;
    (LZ4_streamDecode->internal_donotuse).prefixEnd =
         (LZ4_streamDecode->internal_donotuse).prefixEnd + uVar9;
  }
  return uVar9;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_continue (LZ4_streamDecode_t* LZ4_streamDecode, const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    LZ4_streamDecode_t_internal* lz4sd = &LZ4_streamDecode->internal_donotuse;
    int result;

    if (lz4sd->prefixSize == 0) {
        /* The first call, no dictionary yet. */
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd = (BYTE*)dest + result;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        /* They're rolling the current segment. */
        if (lz4sd->prefixSize >= 64 KB - 1)
            result = LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        else if (lz4sd->extDictSize == 0)
            result = LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize,
                                                         lz4sd->prefixSize);
        else
            result = LZ4_decompress_safe_doubleDict(source, dest, compressedSize, maxOutputSize,
                                                    lz4sd->prefixSize, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)result;
        lz4sd->prefixEnd  += result;
    } else {
        /* The buffer wraps around, or they're switching to another buffer. */
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize,
                                                  lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd  = (BYTE*)dest + result;
    }

    return result;
}